

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,LoopStatement *l)

{
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Statement>>(this,&l->iterator);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Statement>>(this,&l->body);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&l->condition);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&l->numIterations);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::VariableDeclaration>>
            (this,&l->rangeLoopInitialiser);
  return;
}

Assistant:

virtual void visit (AST::LoopStatement& l)
    {
        visitObjectIfNotNull (l.iterator);
        visitObjectIfNotNull (l.body);
        visitObjectIfNotNull (l.condition);
        visitObjectIfNotNull (l.numIterations);
        visitObjectIfNotNull (l.rangeLoopInitialiser);
    }